

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ResponseOrProtocolError * __thiscall
kj::HttpHeaders::tryParseResponse
          (ResponseOrProtocolError *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<char> content)

{
  bool bVar1;
  NullableValue<kj::StringPtr> *other;
  StringPtr *pSVar2;
  NullableValue<unsigned_int> *other_00;
  uint *puVar3;
  ArrayPtr<char> content_00;
  ProtocolError local_200;
  ArrayPtr<const_char> local_1c8;
  ProtocolError local_1b8;
  uint *local_180;
  uint *code;
  NullableValue<unsigned_int> local_170;
  NullableValue<unsigned_int> _code1017;
  StringPtr local_160;
  StringPtr local_150;
  HttpHeaders *local_140;
  char *pcStack_138;
  uint local_12c;
  ProtocolError local_128;
  StringPtr local_f0;
  StringPtr *local_e0;
  StringPtr *version;
  Maybe<kj::StringPtr> local_c8;
  undefined1 local_b0 [8];
  NullableValue<kj::StringPtr> _version1007;
  Response response;
  char *ptr;
  StringPtr SStack_70;
  StringPtr aSStack_60 [3];
  undefined8 local_30;
  char *end;
  HttpHeaders *this_local;
  ArrayPtr<char> content_local;
  
  aSStack_60[2].content.size_ = content.size_;
  content_00.size_ = (kj *)content.ptr;
  content_00.ptr = (char *)aSStack_60[2].content.size_;
  aSStack_60[2].content.ptr = (char *)content_00.size_;
  end = (char *)this;
  this_local = (HttpHeaders *)content_00.size_;
  content_local.ptr = (char *)aSStack_60[2].content.size_;
  content_local.size_ = (size_t)__return_storage_ptr__;
  local_30 = trimHeaderEnding(content_00.size_,content_00);
  if ((char *)local_30 == (char *)0x0) {
    ptr._0_4_ = 0x1f6;
    StringPtr::StringPtr(&SStack_70,"Bad Gateway");
    StringPtr::StringPtr(aSStack_60,"Response headers have no terminal newline.");
    aSStack_60[1].content.ptr = (char *)this_local;
    aSStack_60[1].content.size_ = (size_t)content_local.ptr;
    OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>::
    OneOf<kj::HttpHeaders::ProtocolError,int>
              ((OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError> *)
               __return_storage_ptr__,(ProtocolError *)&ptr);
  }
  else {
    response.statusText.content.size_ = (size_t)ArrayPtr<char>::begin((ArrayPtr<char> *)&this_local)
    ;
    Response::Response((Response *)&_version1007.field_1.value.content.size_);
    consumeWord(&local_c8,(char **)&response.statusText.content.size_);
    other = kj::_::readMaybe<kj::StringPtr>(&local_c8);
    kj::_::NullableValue<kj::StringPtr>::NullableValue
              ((NullableValue<kj::StringPtr> *)local_b0,other);
    Maybe<kj::StringPtr>::~Maybe(&local_c8);
    pSVar2 = kj::_::NullableValue::operator_cast_to_StringPtr_((NullableValue *)local_b0);
    if (pSVar2 == (StringPtr *)0x0) {
      _code1017.isSet = true;
      _code1017._1_3_ = 1;
      StringPtr::StringPtr(&local_160,"Bad Gateway");
      StringPtr::StringPtr(&local_150,"Invalid response status line (no spaces).");
      local_140 = this_local;
      pcStack_138 = content_local.ptr;
      OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>::
      OneOf<kj::HttpHeaders::ProtocolError,int>
                ((OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError> *)
                 __return_storage_ptr__,(ProtocolError *)&_code1017);
      local_12c = 1;
    }
    else {
      pSVar2 = kj::_::NullableValue<kj::StringPtr>::operator*
                         ((NullableValue<kj::StringPtr> *)local_b0);
      local_e0 = pSVar2;
      StringPtr::StringPtr(&local_f0,"HTTP/");
      bVar1 = StringPtr::startsWith(pSVar2,&local_f0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_12c = 0;
      }
      else {
        local_128.statusCode = 0x1f6;
        StringPtr::StringPtr(&local_128.statusMessage,"Bad Gateway");
        StringPtr::StringPtr
                  (&local_128.description,"Invalid response status line (invalid protocol).");
        local_128.rawContent.ptr = (char *)this_local;
        local_128.rawContent.size_ = (size_t)content_local.ptr;
        OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>::
        OneOf<kj::HttpHeaders::ProtocolError,int>
                  ((OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError> *)
                   __return_storage_ptr__,&local_128);
        local_12c = 1;
      }
    }
    kj::_::NullableValue<kj::StringPtr>::~NullableValue((NullableValue<kj::StringPtr> *)local_b0);
    if (local_12c == 0) {
      consumeNumber((kj *)&code,(char **)&response.statusText.content.size_);
      other_00 = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&code);
      kj::_::NullableValue<unsigned_int>::NullableValue(&local_170,other_00);
      Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&code);
      puVar3 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_170);
      if (puVar3 == (uint *)0x0) {
        local_1b8.statusCode = 0x1f6;
        StringPtr::StringPtr(&local_1b8.statusMessage,"Bad Gateway");
        StringPtr::StringPtr
                  (&local_1b8.description,"Invalid response status line (invalid status code).");
        local_1b8.rawContent.ptr = (char *)this_local;
        local_1b8.rawContent.size_ = (size_t)content_local.ptr;
        OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>::
        OneOf<kj::HttpHeaders::ProtocolError,int>
                  ((OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError> *)
                   __return_storage_ptr__,&local_1b8);
      }
      else {
        local_180 = kj::_::NullableValue<unsigned_int>::operator*(&local_170);
        _version1007.field_1.value.content.size_._0_4_ = *local_180;
      }
      local_12c = (uint)(puVar3 == (uint *)0x0);
      kj::_::NullableValue<unsigned_int>::~NullableValue(&local_170);
      if (local_12c == 0) {
        local_1c8 = (ArrayPtr<const_char>)consumeLine((char **)&response.statusText.content.size_);
        response._0_8_ = local_1c8.ptr;
        response.statusText.content.ptr = (char *)local_1c8.size_;
        bVar1 = parseHeaders(this,(char *)response.statusText.content.size_,(char *)local_30);
        if (bVar1) {
          OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>::
          OneOf<kj::HttpHeaders::Response,int>
                    ((OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError> *)
                     __return_storage_ptr__,(Response *)&_version1007.field_1.value.content.size_);
        }
        else {
          local_200.statusCode = 0x1f6;
          StringPtr::StringPtr(&local_200.statusMessage,"Bad Gateway");
          StringPtr::StringPtr
                    (&local_200.description,"The headers sent by the server are not valid.");
          local_200.rawContent.ptr = (char *)this_local;
          local_200.rawContent.size_ = (size_t)content_local.ptr;
          OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError>::
          OneOf<kj::HttpHeaders::ProtocolError,int>
                    ((OneOf<kj::HttpHeaders::Response,kj::HttpHeaders::ProtocolError> *)
                     __return_storage_ptr__,&local_200);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HttpHeaders::ResponseOrProtocolError HttpHeaders::tryParseResponse(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) {
    return ProtocolError { 502, "Bad Gateway",
        "Response headers have no terminal newline.", content };
  }

  char* ptr = content.begin();

  HttpHeaders::Response response;

  KJ_IF_SOME(version, consumeWord(ptr)) {
    if (!version.startsWith("HTTP/")) {
      return ProtocolError { 502, "Bad Gateway",
          "Invalid response status line (invalid protocol).", content };
    }
  } else {
    return ProtocolError { 502, "Bad Gateway",
        "Invalid response status line (no spaces).", content };
  }